

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O0

int Gia_ManFlattenLogicPrepare(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  int local_28;
  int local_24;
  int k;
  int i;
  Abc_Obj_t *pBox;
  Abc_Obj_t *pTerm;
  Abc_Ntk_t *pNtk_local;
  
  Abc_NtkFillTemp(pNtk);
  for (local_24 = 0; iVar1 = Abc_NtkPiNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar3 = Abc_NtkPi(pNtk,local_24);
    (pAVar3->field_5).iData = local_24;
  }
  for (local_24 = 0; iVar1 = Abc_NtkPoNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar3 = Abc_NtkPo(pNtk,local_24);
    (pAVar3->field_5).iData = local_24;
  }
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(pNtk->vBoxes);
    if (iVar1 <= local_24) {
      iVar1 = Abc_NtkPiNum(pNtk);
      iVar2 = Abc_NtkPoNum(pNtk);
      return iVar1 + iVar2;
    }
    pAVar3 = Abc_NtkBox(pNtk,local_24);
    iVar1 = Abc_ObjIsLatch(pAVar3);
    if (iVar1 != 0) break;
    for (local_28 = 0; iVar1 = Abc_ObjFaninNum(pAVar3), local_28 < iVar1; local_28 = local_28 + 1) {
      pAVar4 = Abc_ObjFanin(pAVar3,local_28);
      (pAVar4->field_5).iData = local_28;
    }
    for (local_28 = 0; iVar1 = Abc_ObjFanoutNum(pAVar3), local_28 < iVar1; local_28 = local_28 + 1)
    {
      pAVar4 = Abc_ObjFanout(pAVar3,local_28);
      (pAVar4->field_5).iData = local_28;
    }
    local_24 = local_24 + 1;
  }
  __assert_fail("!Abc_ObjIsLatch(pBox)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                ,0x16e,"int Gia_ManFlattenLogicPrepare(Abc_Ntk_t *)");
}

Assistant:

int Gia_ManFlattenLogicPrepare( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pTerm, * pBox; 
    int i, k;
    Abc_NtkFillTemp( pNtk );
    Abc_NtkForEachPi( pNtk, pTerm, i )
        pTerm->iData = i;
    Abc_NtkForEachPo( pNtk, pTerm, i )
        pTerm->iData = i;
    Abc_NtkForEachBox( pNtk, pBox, i )
    {
        assert( !Abc_ObjIsLatch(pBox) );
        Abc_ObjForEachFanin( pBox, pTerm, k )
            pTerm->iData = k;
        Abc_ObjForEachFanout( pBox, pTerm, k )
            pTerm->iData = k;
    }
    return Abc_NtkPiNum(pNtk) + Abc_NtkPoNum(pNtk);
}